

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

int __thiscall FIX::double_conversion::UInt128::DivModPowerOf2(UInt128 *this,int power)

{
  int iVar1;
  byte bVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  bVar2 = (byte)power;
  if (power < 0x40) {
    uVar4 = this->low_bits_ >> (bVar2 & 0x3f);
    iVar1 = (int)(this->high_bits_ << (-bVar2 & 0x3f)) + (int)uVar4;
    this->low_bits_ = this->low_bits_ - (uVar4 << (bVar2 & 0x3f));
    uVar3 = 0;
  }
  else {
    iVar1 = (int)(this->high_bits_ >> (bVar2 & 0x3f));
    uVar3 = this->high_bits_ - ((long)iVar1 << (bVar2 & 0x3f));
  }
  this->high_bits_ = uVar3;
  return iVar1;
}

Assistant:

int DivModPowerOf2(int power) {
    if (power >= 64) {
      int result = static_cast<int>(high_bits_ >> (power - 64));
      high_bits_ -= static_cast<uint64_t>(result) << (power - 64);
      return result;
    } else {
      uint64_t part_low = low_bits_ >> power;
      uint64_t part_high = high_bits_ << (64 - power);
      int result = static_cast<int>(part_low + part_high);
      high_bits_ = 0;
      low_bits_ -= part_low << power;
      return result;
    }
  }